

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition-parse.c
# Opt level: O0

int xml_root_init(parser_info *info,char **attr)

{
  int iVar1;
  char *pcVar2;
  coda_type_record *pcVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar4;
  char *name;
  char **attr_local;
  parser_info *info_local;
  
  uVar4 = 0;
  if (info->product_definition != (coda_product_definition *)0x0) {
    iVar1 = handle_format_attribute_for_type(info,attr);
    if (iVar1 == 0) {
      if (info->node->format == coda_format_xml) {
        pcVar2 = get_attribute_value(attr,"name");
        if (pcVar2 == (char *)0x0) {
          pcVar2 = get_attribute_value(attr,"namexml");
          if (pcVar2 == (char *)0x0) {
            info->node->free_data = coda_type_release;
            pcVar3 = coda_type_record_new(coda_format_xml);
            info->node->data = pcVar3;
            iVar1 = handle_name_attribute_for_type(info,attr);
            if (iVar1 == 0) {
              register_sub_element
                        (info->node,element_cd_description,string_data_init,type_set_description);
              register_sub_element(info->node,element_cd_field,cd_field_init,xml_root_set_field);
              info_local._4_4_ = 0;
            }
            else {
              info_local._4_4_ = -1;
            }
          }
          else {
            coda_set_error(-400,"attribute \'namexml\' not allowed for xml root record");
            info_local._4_4_ = -1;
          }
        }
        else {
          coda_set_error(-400,"attribute \'name\' not allowed for xml root record");
          info_local._4_4_ = -1;
        }
      }
      else {
        pcVar2 = coda_type_get_format_name(info->node->format);
        coda_set_error(-400,"%s record not allowed for xml product definition %s",pcVar2,
                       info->product_definition->name,in_R8,in_R9,uVar4);
        info_local._4_4_ = -1;
      }
    }
    else {
      info_local._4_4_ = -1;
    }
    return info_local._4_4_;
  }
  __assert_fail("info->product_definition != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition-parse.c"
                ,0x4a5,"int xml_root_init(parser_info *, const char **)");
}

Assistant:

static int xml_root_init(parser_info *info, const char **attr)
{
    const char *name = NULL;

    assert(info->product_definition != NULL);
    if (handle_format_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }
    if (info->node->format != coda_format_xml)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "%s record not allowed for xml product definition %s",
                       coda_type_get_format_name(info->node->format), info->product_definition->name);
        return -1;
    }
    name = get_attribute_value(attr, "name");
    if (name != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "attribute 'name' not allowed for xml root record");
        return -1;
    }
    name = get_attribute_value(attr, "namexml");
    if (name != NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "attribute 'namexml' not allowed for xml root record");
        return -1;
    }
    info->node->free_data = (free_data_handler)coda_type_release;
    info->node->data = coda_type_record_new(coda_format_xml);

    if (handle_name_attribute_for_type(info, attr) != 0)
    {
        return -1;
    }

    register_sub_element(info->node, element_cd_description, string_data_init, type_set_description);
    register_sub_element(info->node, element_cd_field, cd_field_init, xml_root_set_field);

    return 0;
}